

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::Logger::logv(Logger *this,char *fmt,__va_list_tag *ap)

{
  long *in_RDI;
  Error _err;
  StringTmp<2048UL> sb;
  StringTmp<2048UL> *in_stack_fffffffffffff718;
  StringTmp<2048UL> local_8a0;
  undefined1 auStack_89f [7];
  StringTmp<2048UL> *local_898;
  undefined1 *local_888;
  __va_list_tag *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  ModifyOp in_stack_fffffffffffffbb4;
  String *in_stack_fffffffffffffbb8;
  Error local_5c;
  
  memset(&local_8a0,0,0x20);
  StringTmp<2048UL>::_resetToTemporary(&local_8a0);
  local_5c = String::_opVFormat(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                                in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  if (local_5c == 0) {
    in_stack_fffffffffffff718 = local_898;
    if ((byte)local_8a0 < 0x1f) {
      local_888 = auStack_89f;
      in_stack_fffffffffffff718 = (StringTmp<2048UL> *)(ulong)(byte)local_8a0;
    }
    local_5c = (**(code **)(*in_RDI + 0x10))(in_RDI,local_888,in_stack_fffffffffffff718);
  }
  StringTmp<2048UL>::~StringTmp(in_stack_fffffffffffff718);
  return local_5c;
}

Assistant:

Error Logger::logv(const char* fmt, va_list ap) noexcept {
  StringTmp<2048> sb;
  ASMJIT_PROPAGATE(sb.appendVFormat(fmt, ap));
  return log(sb);
}